

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O3

void __thiscall
de::AppendList<vk::DebugReportMessage>::append
          (AppendList<vk::DebugReportMessage> *this,DebugReportMessage *value)

{
  size_t *psVar1;
  DebugReportMessage *pDVar2;
  pointer pcVar3;
  VkDebugReportFlagsEXT VVar4;
  VkDebugReportObjectTypeEXT VVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  deInt32 dVar8;
  deUint64 dVar9;
  size_t sVar10;
  ulong uVar11;
  Block *pBVar12;
  DebugReportMessage *pDVar13;
  ulong uVar14;
  Block *pBVar15;
  ulong uVar16;
  
  pBVar15 = this->m_last;
  LOCK();
  psVar1 = &this->m_numElements;
  uVar14 = *psVar1;
  *psVar1 = *psVar1 + 1;
  UNLOCK();
  uVar16 = this->m_blockSize;
  uVar11 = uVar14 / uVar16;
  uVar14 = uVar14 % uVar16;
  if (pBVar15->blockNdx != uVar11) {
    do {
      if (pBVar15->next == (Block *)0x0) {
        deYield();
      }
      else {
        pBVar15 = pBVar15->next;
      }
    } while (pBVar15->blockNdx != uVar11);
    uVar16 = this->m_blockSize;
  }
  if (uVar14 + 1 == uVar16) {
    pBVar12 = (Block *)operator_new(0x18);
    pBVar12->blockNdx = uVar11 + 1;
    pDVar13 = (DebugReportMessage *)deAlignedMalloc(uVar16 * 0x60,8);
    pBVar12->elements = pDVar13;
    pBVar12->next = (Block *)0x0;
    this->m_last = pBVar12;
    pBVar15->next = pBVar12;
  }
  pDVar2 = pBVar15->elements;
  VVar4 = value->flags;
  VVar5 = value->objectType;
  dVar9 = value->object;
  uVar6 = *(undefined4 *)((long)&value->object + 4);
  sVar10 = value->location;
  uVar7 = *(undefined4 *)((long)&value->location + 4);
  dVar8 = value->messageCode;
  pDVar13 = pDVar2 + uVar14;
  *(undefined4 *)((long)&pDVar13->object + 4) = *(undefined4 *)((long)&value->object + 4);
  *(int *)&pDVar13->location = (int)sVar10;
  *(undefined4 *)((long)&pDVar13->location + 4) = uVar7;
  pDVar13->messageCode = dVar8;
  pDVar13->flags = VVar4;
  pDVar13->objectType = VVar5;
  *(int *)&pDVar13->object = (int)dVar9;
  *(undefined4 *)((long)&pDVar13->object + 4) = uVar6;
  pDVar2[uVar14].layerPrefix._M_dataplus._M_p = (pointer)&pDVar2[uVar14].layerPrefix.field_2;
  pcVar3 = (value->layerPrefix)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pDVar13->layerPrefix,pcVar3,pcVar3 + (value->layerPrefix)._M_string_length);
  pDVar2[uVar14].message._M_dataplus._M_p = (pointer)&pDVar2[uVar14].message.field_2;
  pcVar3 = (value->message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pDVar2[uVar14].message,pcVar3,pcVar3 + (value->message)._M_string_length);
  return;
}

Assistant:

void AppendList<ElementType>::append (const ElementType& value)
{
	// Fetch curBlock first before allocating slot. Otherwise m_last might get updated before
	// this thread gets chance of reading it, leading to curBlock->blockNdx > blockNdx.
	Block*			curBlock	= m_last;

	deMemoryReadWriteFence();

	{
		const size_t	elementNdx	= deAtomicIncrementUSize(&m_numElements) - 1;
		const size_t	blockNdx	= elementNdx / m_blockSize;
		const size_t	slotNdx		= elementNdx - (blockNdx * m_blockSize);

		while (curBlock->blockNdx != blockNdx)
		{
			if (curBlock->next)
				curBlock = curBlock->next;
			else
			{
				// Other thread(s) are currently allocating additional block(s)
				deYield();
			}
		}

		// Did we allocate last slot? If so, add a new block
		if (slotNdx+1 == m_blockSize)
		{
			Block* const	newBlock	= new Block(blockNdx+1, m_blockSize);

			deMemoryReadWriteFence();

			// At this point if any other thread is trying to allocate more blocks
			// they are being blocked by curBlock->next being null. This guarantees
			// that this thread has exclusive modify access to m_last.
			m_last = newBlock;
			deMemoryReadWriteFence();

			// At this point other threads might have skipped to newBlock, but we
			// still have exclusive modify access to curBlock->next.
			curBlock->next = newBlock;
			deMemoryReadWriteFence();
		}

		new (&curBlock->elements[slotNdx]) ElementType(value);
	}
}